

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O2

void __thiscall
TEST_WiningStateTest_BonusTiles_Test::testBody(TEST_WiningStateTest_BonusTiles_Test *this)

{
  WiningState *this_00;
  set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *this_01;
  size_type sVar1;
  UtestShell *pUVar2;
  size_type sVar3;
  char *pcVar4;
  char *pcVar5;
  int value;
  SimpleString local_c8;
  SimpleString local_c0;
  TestTerminatorWithoutExceptions local_b8;
  key_type local_ac;
  DoublingFactorReport r;
  
  TEST_GROUP_CppUTestGroupWiningStateTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,OneOfBamboos);
  TEST_GROUP_CppUTestGroupWiningStateTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,TwoOfBamboos);
  TEST_GROUP_CppUTestGroupWiningStateTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,ThreeOfCharacters);
  TEST_GROUP_CppUTestGroupWiningStateTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,SixOfCircles);
  TEST_GROUP_CppUTestGroupWiningStateTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,SevenOfCharacters);
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).s;
  mahjong::WiningState::addBonusTile(this_00,OneOfBamboos);
  mahjong::WiningState::addBonusTile(this_00,SixOfCircles);
  mahjong::WiningState::addBonusTile(this_00,NineOfCharacters);
  mahjong::WiningState::selfDrawn(this_00,(SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report(&r,&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).c)
  ;
  this_01 = &r.patterns;
  local_c8.buffer_._0_4_ = 8;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count(this_01,(key_type *)&local_c8);
  value = (int)&local_c8;
  if (sVar1 == 1) {
    pUVar2 = UtestShell::getCurrent();
    local_c8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xe8,&local_c8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_c8);
  }
  else {
    local_c8.buffer_._0_4_ = 8;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_01,(key_type *)&local_c8);
    local_c0.buffer_._0_4_ = 8;
    sVar3 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_01,(key_type *)&local_c0);
    if (sVar1 != sVar3) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                 ,0xe8);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_c8);
    local_ac = SelfDrawn;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count(this_01,&local_ac);
    StringFrom((unsigned_long)&local_c0);
    pcVar5 = SimpleString::asCharString(&local_c0);
    local_b8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xe8,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_b8);
    SimpleString::~SimpleString(&local_c0);
    SimpleString::~SimpleString(&local_c8);
  }
  if (r.bonus_tile_count == 6) {
    pUVar2 = UtestShell::getCurrent();
    local_c8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xe9,&local_c8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_c8);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_c8);
    StringFrom((int)&local_c0);
    pcVar5 = SimpleString::asCharString(&local_c0);
    local_b8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xe9,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_b8);
    SimpleString::~SimpleString(&local_c0);
    SimpleString::~SimpleString(&local_c8);
  }
  if (r.doubling_factor == 7) {
    pUVar2 = UtestShell::getCurrent();
    local_c8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xea,&local_c8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_c8);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_c8);
    StringFrom((int)&local_c0);
    pcVar5 = SimpleString::asCharString(&local_c0);
    local_b8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xea,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_b8);
    SimpleString::~SimpleString(&local_c0);
    SimpleString::~SimpleString(&local_c8);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport(&r);
  return;
}

Assistant:

TEST(WiningStateTest, BonusTiles)
{
	addPair(Tile::OneOfBamboos);
	addSequence(Tile::TwoOfBamboos);
	addSequence(Tile::ThreeOfCharacters);
	addTriplet(Tile::SixOfCircles);
	addSequence(Tile::SevenOfCharacters);

	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::SixOfCircles);
	s.addBonusTile(Tile::NineOfCharacters);

	selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::SelfDrawn));
	CHECK_EQUAL(6, r.bonus_tile_count);
	CHECK_EQUAL(7, r.doubling_factor);
}